

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Visibility slang::ast::Lookup::getVisibility(Symbol *symbol)

{
  MethodPrototypeSymbol *pMVar1;
  ClassPropertySymbol *pCVar2;
  SubroutineSymbol *pSVar3;
  TypeAliasType *pTVar4;
  undefined4 *in_RDI;
  Visibility local_4;
  
  switch(*in_RDI) {
  case 0x23:
    pTVar4 = Symbol::as<slang::ast::TypeAliasType>((Symbol *)0x698b8e);
    local_4 = pTVar4->visibility;
    break;
  default:
    local_4 = Public;
    break;
  case 0x3f:
    pCVar2 = Symbol::as<slang::ast::ClassPropertySymbol>((Symbol *)0x698b62);
    local_4 = pCVar2->visibility;
    break;
  case 0x40:
    pSVar3 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x698b78);
    local_4 = pSVar3->visibility;
    break;
  case 0x44:
    pMVar1 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x698b4c);
    local_4 = pMVar1->visibility;
  }
  return local_4;
}

Assistant:

Visibility Lookup::getVisibility(const Symbol& symbol) {
    switch (symbol.kind) {
        case SymbolKind::MethodPrototype:
            return symbol.as<MethodPrototypeSymbol>().visibility;
        case SymbolKind::ClassProperty:
            return symbol.as<ClassPropertySymbol>().visibility;
        case SymbolKind::Subroutine:
            return symbol.as<SubroutineSymbol>().visibility;
        case SymbolKind::TypeAlias:
            return symbol.as<TypeAliasType>().visibility;
        default:
            return Visibility::Public;
    }
}